

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNode.cpp
# Opt level: O3

DDLNode * ODDLParser::DDLNode::create(string *type,string *name,DDLNode *parent)

{
  DDLNode *this;
  long lVar1;
  DDLNode *node;
  DDLNode *local_30;
  
  lVar1 = (long)DAT_008df840._M_current - s_allocatedNodes;
  this = (DDLNode *)operator_new(0x88);
  DDLNode(this,type,name,lVar1 >> 3,parent);
  local_30 = this;
  if (DAT_008df840._M_current == DAT_008df848) {
    std::vector<ODDLParser::DDLNode*,std::allocator<ODDLParser::DDLNode*>>::
    _M_realloc_insert<ODDLParser::DDLNode*const&>
              ((vector<ODDLParser::DDLNode*,std::allocator<ODDLParser::DDLNode*>> *)
               &s_allocatedNodes,DAT_008df840,&local_30);
  }
  else {
    *DAT_008df840._M_current = this;
    DAT_008df840._M_current = DAT_008df840._M_current + 1;
  }
  return local_30;
}

Assistant:

DDLNode *DDLNode::create( const std::string &type, const std::string &name, DDLNode *parent ) {
    const size_t idx( s_allocatedNodes.size() );
    DDLNode *node = new DDLNode( type, name, idx, parent );
    s_allocatedNodes.push_back( node );
    
    return node;
}